

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  int iVar1;
  ulong uVar2;
  string local_80;
  size_type *local_60;
  string doubleDash;
  allocator local_31;
  
  local_60 = &doubleDash._M_string_length;
  doubleDash.field_2._8_8_ = tokens;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"--","");
  if (1 < argc) {
    uVar2 = 1;
    do {
      iVar1 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar1 == 0) break;
      std::__cxx11::string::string((string *)&local_80,argv[uVar2],&local_31);
      parseIntoTokens(this,&local_80,
                      (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       *)doubleDash.field_2._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  if (local_60 != &doubleDash._M_string_length) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }